

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  undefined4 extraout_var;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Wlc_Obj_t *pWVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int local_b0;
  int local_ac;
  char *local_a8;
  ulong local_a0;
  int local_98 [26];
  
  local_a8 = pName;
  do {
    if (iNode < 0) {
LAB_00370218:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((iNode & 1U) != 0) {
      pcVar5 = Abc_NamStr(p->pStrs,(uint)iNode >> 1);
      if (*pcVar5 != '#' && 9 < (byte)(*pcVar5 - 0x30U)) {
        iVar2 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar5,local_98);
        if (local_98[0] != 0) {
          return iVar2;
        }
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x2a9,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
LAB_0036fd60:
      iVar2 = Smt_PrsBuildConstant(pNtk,pcVar5,RangeOut,local_a8);
      return iVar2;
    }
    uVar10 = (uint)iNode >> 1;
    if ((p->vObjs).nSize <= (int)uVar10) {
LAB_00370256:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar1 = (p->vObjs).pArray;
    if (pVVar1[uVar10].nSize < 1) goto LAB_00370237;
    uVar12 = *pVVar1[uVar10].pArray;
    if ((int)uVar12 < 0) goto LAB_00370218;
    if ((uVar12 & 1) == 0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = Abc_NamStr(p->pStrs,uVar12 >> 1);
    }
    if (pVVar1[uVar10].nSize < 2) goto LAB_00370237;
    uVar12 = pVVar1[uVar10].pArray[1];
    if ((int)uVar12 < 0) goto LAB_00370218;
    if ((uVar12 & 1) == 0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
    }
    if ((((pcVar9 != (char *)0x0) && (pcVar5 != (char *)0x0)) && (*pcVar9 == '_')) &&
       ((*pcVar5 == 'b' && (pcVar5[1] == 'v')))) {
      if (pVVar1[uVar10].nSize < 3) goto LAB_00370237;
      uVar12 = pVVar1[uVar10].pArray[2];
      if (-1 < (int)uVar12) {
        if ((uVar12 & 1) == 0) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = Abc_NamStr(p->pStrs,uVar12 >> 1);
        }
        if (pVVar1[uVar10].nSize != 3) {
          __assert_fail("Vec_IntSize(vFans) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                        ,0x2b6,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        pcVar5 = pcVar5 + 2;
        RangeOut = atoi(pcVar9);
        goto LAB_0036fd60;
      }
      goto LAB_00370218;
    }
    if ((pcVar9 == (char *)0x0) || (*pcVar9 != '=')) {
      if (pVVar1[uVar10].nSize < 1) goto LAB_00370237;
      uVar12 = *pVVar1[uVar10].pArray;
      if ((int)uVar12 < 0) goto LAB_00370218;
      if ((uVar12 & 1) == 0) {
        uVar12 = uVar12 >> 1;
        if ((p->vObjs).nSize <= (int)uVar12) goto LAB_00370256;
        pVVar6 = (p->vObjs).pArray;
        if (pVVar6[uVar12].nSize < 1) goto LAB_00370237;
        uVar4 = *pVVar6[uVar12].pArray;
        if ((int)uVar4 < 0) goto LAB_00370218;
        if ((uVar4 & 1) == 0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = Abc_NamStr(p->pStrs,uVar4 >> 1);
        }
        if (pVVar6[uVar12].nSize < 3) {
          __assert_fail("Vec_IntSize(vFans) >= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                        ,0xf8,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        iVar2 = strcmp(pcVar5,"_");
        if (iVar2 != 0) {
          __assert_fail("!strcmp(pStr, \"_\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                        ,0xf9,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        if ((*pcVar5 == 'b') && (pcVar5[1] == 'v')) {
          __assert_fail("pStr[0] != \'b\' || pStr[1] != \'v\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                        ,0xfb,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        uVar4 = pVVar6[uVar12].pArray[1];
        if ((int)uVar4 < 0) goto LAB_00370218;
        pcVar5 = (char *)0x0;
        if ((uVar4 & 1) != 0) {
          pcVar5 = Abc_NamStr(p->pStrs,uVar4 >> 1);
        }
        uVar4 = Smt_StrToType(pcVar5,&local_ac);
        local_b0 = -1;
        if (uVar4 == 0) {
          uVar4 = 0xffffffff;
          local_a0 = 0;
        }
        else {
          if (pVVar6[uVar12].nSize < 3) goto LAB_00370237;
          uVar13 = (ulong)uVar4;
          uVar4 = pVVar6[uVar12].pArray[2];
          if ((int)uVar4 < 0) goto LAB_00370218;
          if ((uVar4 & 1) == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Abc_NamStr(p->pStrs,uVar4 >> 1);
          }
          uVar4 = atoi(pcVar5);
          local_a0 = uVar13;
          if (3 < pVVar6[uVar12].nSize) {
            uVar12 = pVVar6[uVar12].pArray[3];
            if ((int)uVar12 < 0) goto LAB_00370218;
            if ((uVar12 & 1) == 0) {
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            }
            local_b0 = atoi(pcVar5);
          }
        }
      }
      else {
        pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
        iVar2 = Smt_StrToType(pcVar5,&local_ac);
        local_a0 = CONCAT44(extraout_var,iVar2);
        uVar4 = 0xffffffff;
        local_b0 = -1;
      }
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 100;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(400);
      pVVar6->pArray = piVar7;
      if (pVVar1[uVar10].nSize < 2) goto LAB_0036ffe9;
      lVar15 = 1;
      break;
    }
    if (pVVar1[uVar10].nSize != 3) {
      __assert_fail("Vec_IntSize(vFans) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,699,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    uVar12 = pVVar1[uVar10].pArray[2];
    if ((int)uVar12 < 0) goto LAB_00370218;
    if ((uVar12 & 1) == 0) {
      __assert_fail("Smt_EntryIsName(iNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x2bd,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
    iVar2 = strcmp("#b1",pcVar5);
    if (iVar2 != 0) {
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 0x10;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(0x40);
      pVVar6->pArray = piVar7;
      iVar2 = Smt_PrsBuildConstant(pNtk,pcVar5,-1,(char *)0x0);
      pcVar5 = local_a8;
      if (pVVar1[uVar10].nSize < 2) goto LAB_00370237;
      iVar3 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar10].pArray[1],-1,local_a8);
      Vec_IntPush(pVVar6,iVar3);
      Vec_IntPush(pVVar6,iVar2);
      iVar2 = Smt_PrsCreateNode(pNtk,0x1f,0,1,pVVar6,pcVar5);
      if (pVVar6->pArray != (int *)0x0) {
        free(pVVar6->pArray);
        pVVar6->pArray = (int *)0x0;
      }
      goto LAB_003701ca;
    }
    if (pVVar1[uVar10].nSize < 2) goto LAB_00370237;
    iNode = pVVar1[uVar10].pArray[1];
    RangeOut = -1;
  } while( true );
  while( true ) {
    Vec_IntPush(pVVar6,iVar2);
    lVar15 = lVar15 + 1;
    if (pVVar1[uVar10].nSize <= lVar15) break;
    iVar2 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar10].pArray[lVar15],-1,(char *)0x0);
    if (iVar2 == 0) {
      piVar7 = pVVar6->pArray;
      iVar2 = 0;
      goto LAB_003701b5;
    }
  }
LAB_0036ffe9:
  iVar2 = (int)local_a0;
  if (0xfffffffd < iVar2 - 0x1aU) {
    __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x2e5,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
  }
  if (iVar2 == 0x16) {
    if ((((int)uVar4 < 0) || (local_b0 < 0)) || ((int)uVar4 < local_b0)) {
      __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x2e8,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    Vec_IntPush(pVVar6,uVar4);
    Vec_IntPush(pVVar6,local_b0);
  }
  else if (iVar2 - 0xdU < 2) {
    if ((int)uVar4 < 0) {
      __assert_fail("Value1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x2ee,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    sprintf((char *)local_98,"%d",(ulong)uVar4);
    iVar3 = Smt_PrsBuildConstant(pNtk,(char *)local_98,-1,(char *)0x0);
    Vec_IntPush(pVVar6,iVar3);
  }
  iVar3 = 1;
  if (0xd < iVar2 - 0x1aU) {
    if (iVar2 == 0x16) {
      iVar3 = (uVar4 - local_b0) + 1;
    }
    else {
      uVar10 = pVVar6->nSize;
      if (iVar2 == 8) {
        if (uVar10 != 3) {
          __assert_fail("Vec_IntSize(vFanins) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                        ,0x301,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        piVar7 = pVVar6->pArray;
        iVar3 = piVar7[1];
        iVar11 = piVar7[2];
        piVar7[1] = iVar11;
        piVar7[2] = iVar3;
        if (pVVar6->nSize < 2) {
LAB_00370237:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
      }
      else {
        if (iVar2 == 0x17) {
          if ((int)uVar10 < 1) {
            iVar3 = 0;
          }
          else {
            uVar13 = 0;
            iVar3 = 0;
            do {
              lVar15 = (long)pVVar6->pArray[uVar13];
              if ((lVar15 < 1) || (pNtk->nObjsAlloc <= pVVar6->pArray[uVar13])) {
                __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                              ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
              }
              iVar14 = pNtk->pObjs[lVar15].End - pNtk->pObjs[lVar15].Beg;
              iVar11 = -iVar14;
              if (0 < iVar14) {
                iVar11 = iVar14;
              }
              iVar3 = iVar3 + iVar11 + 1;
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
          goto LAB_00370190;
        }
        if ((int)uVar10 < 1) goto LAB_00370237;
        iVar11 = *pVVar6->pArray;
      }
      pWVar8 = Wlc_NtkObj(pNtk,iVar11);
      iVar11 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar11;
      if (0 < iVar11) {
        iVar3 = iVar11;
      }
      iVar3 = iVar3 + 1;
    }
  }
LAB_00370190:
  if (iVar3 < 1) {
    __assert_fail("Range > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x30c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
  }
  iVar2 = Smt_PrsCreateNode(pNtk,iVar2,local_ac,iVar3,pVVar6,local_a8);
  piVar7 = pVVar6->pArray;
LAB_003701b5:
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    pVVar6->pArray = (int *)0x0;
  }
LAB_003701ca:
  free(pVVar6);
  return iVar2;
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr1+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPushTwo( vFanins, Value1, Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[100];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}